

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.cpp
# Opt level: O3

bool __thiscall
AttributeTypeAndValue::Decode(AttributeTypeAndValue *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  DecodeResult DVar4;
  size_t sVar5;
  byte bVar6;
  undefined1 auStack_58 [8];
  SequenceHelper sh;
  
  auStack_58 = (undefined1  [8])0x0;
  sh.dataSize = 0;
  sh.prefixSize = 0;
  sh.cbUsed._0_1_ = 0;
  sh.cbCurrent = (size_t)cbUsed;
  DVar4 = SequenceHelper::Init((SequenceHelper *)auStack_58,pIn,cbIn,&(this->super_DerBase).cbData);
  sVar2 = sh.dataSize;
  if (DVar4 < Success) {
    bVar6 = 6 >> ((byte)DVar4 & 7);
  }
  else {
    lVar1 = *(long *)sh.cbCurrent;
    sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
    bVar3 = ObjectIdentifier::Decode(&this->type,pIn + sVar2 + lVar1,sVar5,&sh.prefixSize);
    sVar2 = sh.dataSize;
    if (bVar3) {
      *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
      sh.prefixSize = 0;
      lVar1 = *(long *)sh.cbCurrent;
      sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
      bVar6 = AnyType::Decode(&this->value,pIn + sVar2 + lVar1,sVar5,&sh.prefixSize);
    }
    else {
      bVar6 = 0;
    }
  }
  *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
  sh.prefixSize = 0;
  SequenceHelper::CheckExit((SequenceHelper *)auStack_58);
  *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.dataSize;
  return (bool)(bVar6 & 1);
}

Assistant:

bool AttributeTypeAndValue::Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
{
    SequenceHelper sh(cbUsed);

    switch (sh.Init(pIn, cbIn, this->cbData))
    {
    case DecodeResult::Failed:
        return false;
    case DecodeResult::Null:
    case DecodeResult::EmptySequence:
        return true;
    case DecodeResult::Success:
        break;
    }

    if (!type.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    if (!value.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    return true;
}